

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn_live.c
# Opt level: O3

void cmn_live_set(cmn_t *cmn,mfcc_t *vec)

{
  float fVar1;
  int iVar2;
  mfcc_t *pmVar3;
  mfcc_t *pmVar4;
  long lVar5;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
          ,0x37,"Update from < ");
  if (0 < cmn->veclen) {
    lVar5 = 0;
    do {
      err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 < cmn->veclen);
  }
  err_msg(ERR_INFOCONT,(char *)0x0,0,">\n");
  iVar2 = cmn->veclen;
  if (0 < (long)iVar2) {
    pmVar3 = cmn->cmn_mean;
    pmVar4 = cmn->sum;
    lVar5 = 0;
    do {
      fVar1 = (float)vec[lVar5];
      pmVar3[lVar5] = (mfcc_t)fVar1;
      pmVar4[lVar5] = (mfcc_t)(fVar1 * 500.0);
      lVar5 = lVar5 + 1;
    } while (iVar2 != lVar5);
  }
  cmn->nframe = 500;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
          ,0x42,"Update to   < ");
  if (0 < cmn->veclen) {
    lVar5 = 0;
    do {
      err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 < cmn->veclen);
  }
  err_msg(ERR_INFOCONT,(char *)0x0,0,">\n");
  return;
}

Assistant:

void
cmn_live_set(cmn_t *cmn, mfcc_t const * vec)
{
    int32 i;

    E_INFO("Update from < ");
    for (i = 0; i < cmn->veclen; i++)
        E_INFOCONT("%5.2f ", MFCC2FLOAT(cmn->cmn_mean[i]));
    E_INFOCONT(">\n");

    for (i = 0; i < cmn->veclen; i++) {
        cmn->cmn_mean[i] = vec[i];
        cmn->sum[i] = vec[i] * CMN_WIN;
    }
    cmn->nframe = CMN_WIN;

    E_INFO("Update to   < ");
    for (i = 0; i < cmn->veclen; i++)
        E_INFOCONT("%5.2f ", MFCC2FLOAT(cmn->cmn_mean[i]));
    E_INFOCONT(">\n");
}